

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O2

int __thiscall CppJieba::MPSegment::init(MPSegment *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  allocator local_31;
  string local_30;
  
  if ((this->super_SegmentBase)._isInited == true) {
    std::__cxx11::string::string((string *)&local_30,"already inited before now.",&local_31);
    Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x2f,&local_30);
  }
  else {
    iVar2 = Trie::init(&this->_trie,ctx);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::string((string *)&local_30,"_trie.init failed.",&local_31);
      Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x34,&local_30);
    }
    else {
      std::__cxx11::string::string((string *)&local_30,"_trie.loadDict(%s) start...",&local_31);
      Limonp::Logger::LoggingF(1,"MPSegment.hpp",0x37,&local_30,(this->_dictPath)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_30);
      bVar1 = Trie::loadDict(&this->_trie,(this->_dictPath)._M_dataplus._M_p);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_30,"_trie.loadDict end.",&local_31);
        Limonp::Logger::LoggingF(1,"MPSegment.hpp",0x3d,&local_30);
        uVar3 = std::__cxx11::string::~string((string *)&local_30);
        (this->super_SegmentBase)._isInited = true;
        return (int)CONCAT71((int7)((ulong)uVar3 >> 8),1);
      }
      std::__cxx11::string::string((string *)&local_30,"_trie.loadDict faield.",&local_31);
      Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x3a,&local_30);
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

virtual bool init()
            {
                if(_getInitFlag())
                {
                    LogError("already inited before now.");
                    return false;
                }
                if(!_trie.init())
                {
                    LogError("_trie.init failed.");
                    return false;
                }
                LogInfo("_trie.loadDict(%s) start...", _dictPath.c_str());
                if(!_trie.loadDict(_dictPath.c_str()))
                {
                    LogError("_trie.loadDict faield.");
                    return false;
                }
                LogInfo("_trie.loadDict end.");
                return _setInitFlag(true);
            }